

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

bool __thiscall Bstrlib::CBString::operator<(CBString *this,char *s)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  char *s_local;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._8_8_ = s;
  if (s == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"CBString::Failure in compare (<)",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  iVar1 = strcmp((char *)(this->super_tagbstring).data,s);
  return iVar1 < 0;
}

Assistant:

bool CBString::operator < (const char * s) const {
	if (s == NULL) {
		bstringThrow ("Failure in compare (<)");
	}
	return strcmp ((const char *)this->data, s) < 0;
}